

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O1

R2Rect * __thiscall R2Rect::Union(R2Rect *__return_storage_ptr__,R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  S2LogMessage SStack_18;
  
  dVar1 = this->bounds_[0].bounds_.c_[0];
  dVar2 = this->bounds_[0].bounds_.c_[1];
  dVar6 = other->bounds_[0].bounds_.c_[0];
  dVar3 = other->bounds_[0].bounds_.c_[1];
  dVar5 = dVar3;
  dVar7 = dVar6;
  if ((dVar1 <= dVar2) && (dVar5 = dVar2, dVar7 = dVar1, dVar6 <= dVar3)) {
    if (dVar1 <= dVar6) {
      dVar6 = dVar1;
    }
    dVar5 = dVar3;
    dVar7 = dVar6;
    if (dVar3 <= dVar2) {
      dVar5 = dVar2;
    }
  }
  dVar1 = this->bounds_[1].bounds_.c_[0];
  dVar2 = this->bounds_[1].bounds_.c_[1];
  dVar6 = other->bounds_[1].bounds_.c_[0];
  dVar3 = other->bounds_[1].bounds_.c_[1];
  dVar8 = dVar3;
  dVar9 = dVar6;
  if ((dVar1 <= dVar2) && (dVar8 = dVar2, dVar9 = dVar1, dVar6 <= dVar3)) {
    if (dVar1 <= dVar6) {
      dVar6 = dVar1;
    }
    dVar8 = dVar3;
    dVar9 = dVar6;
    if (dVar3 <= dVar2) {
      dVar8 = dVar2;
    }
  }
  lVar4 = 8;
  do {
    *(undefined8 *)((long)__return_storage_ptr__->bounds_[0].bounds_.c_ + lVar4 + -8) =
         0x3ff0000000000000;
    *(undefined8 *)((long)__return_storage_ptr__->bounds_[0].bounds_.c_ + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x28);
  __return_storage_ptr__->bounds_[0].bounds_.c_[0] = dVar7;
  __return_storage_ptr__->bounds_[0].bounds_.c_[1] = dVar5;
  __return_storage_ptr__->bounds_[1].bounds_.c_[0] = dVar9;
  __return_storage_ptr__->bounds_[1].bounds_.c_[1] = dVar8;
  if (dVar5 < dVar7 == dVar9 <= dVar8) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
               ,0xac,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_valid() ",0x19);
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const R2Rect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}